

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O3

bool __thiscall cmFileInstaller::HandleInstallDestination(cmFileInstaller *this)

{
  string *filename;
  char cVar1;
  char cVar2;
  cmExecutionStatus *pcVar3;
  char *pcVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  long *plVar9;
  Status SVar10;
  undefined8 *puVar11;
  long *plVar12;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string errstring;
  string message;
  string sdestdir;
  mode_t *default_dir_mode;
  mode_t default_dir_mode_v;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_b0;
  ulong uStack_98;
  char *local_90;
  undefined8 local_88;
  string local_80;
  string local_60;
  mode_t *local_40;
  mode_t local_34;
  
  filename = &(this->super_cmFileCopier).Destination;
  if (((this->super_cmFileCopier).Destination._M_string_length < 2) &&
     (iVar8 = std::__cxx11::string::compare((char *)filename), iVar8 != 0)) {
    pcVar3 = (this->super_cmFileCopier).Status;
    local_b0.first._M_len = (size_t)&local_b0.second;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,
               "called with inappropriate arguments. No DESTINATION provided or .","");
    std::__cxx11::string::_M_assign((string *)&pcVar3->Error);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_b0.first._M_len
        != &local_b0.second) {
      operator_delete((void *)local_b0.first._M_len,
                      (ulong)((long)&((local_b0.second)->_M_dataplus)._M_p + 1));
    }
    return false;
  }
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  bVar6 = cmsys::SystemTools::GetEnv("DESTDIR",&local_60);
  if (bVar6 && local_60._M_string_length != 0) {
    cmsys::SystemTools::ConvertToUnixSlashes(&local_60);
    pcVar4 = (this->super_cmFileCopier).Destination._M_dataplus._M_p;
    uVar5 = (this->super_cmFileCopier).Destination._M_string_length;
    cVar1 = *pcVar4;
    bVar6 = true;
    if (2 < uVar5) {
      bVar6 = pcVar4[2] != '/';
    }
    cVar2 = pcVar4[1];
    if (cVar1 != '/') {
      if (0x19 < (byte)(cVar1 + 0x9fU)) {
        if ((cVar2 != ':' || bVar6) || (byte)(cVar1 + 0xa5U) < 0xe6) goto LAB_003cc453;
LAB_003cc48e:
        std::__cxx11::string::substr((ulong)&local_80,(ulong)filename);
        plVar9 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_80,0,(char *)0x0,(ulong)local_60._M_dataplus._M_p)
        ;
        plVar12 = plVar9 + 2;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)*plVar9 ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)plVar12) {
          local_b0.second =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar12;
          uStack_98 = plVar9[3];
          local_b0.first._M_len = (size_t)&local_b0.second;
        }
        else {
          local_b0.second =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar12;
          local_b0.first._M_len = (size_t)*plVar9;
        }
        local_b0.first._M_str = (char *)plVar9[1];
        *plVar9 = (long)plVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::operator=((string *)filename,(string *)&local_b0);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
            local_b0.first._M_len != &local_b0.second) {
          operator_delete((void *)local_b0.first._M_len,
                          (ulong)((long)&((local_b0.second)->_M_dataplus)._M_p + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,
                          (ulong)(local_80.field_2._M_allocated_capacity + 1));
        }
        this->DestDirLength = (int)local_60._M_string_length;
        goto LAB_003cc54a;
      }
      if (cVar2 == ':' && !bVar6) goto LAB_003cc48e;
LAB_003cc453:
      pcVar3 = (this->super_cmFileCopier).Status;
      local_b0.first._M_len = (size_t)&local_b0.second;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,
                 "called with relative DESTINATION. This does not make sense when using DESTDIR. Specify absolute path or remove DESTDIR environment variable."
                 ,"");
      std::__cxx11::string::_M_assign((string *)&pcVar3->Error);
      goto LAB_003cc6e6;
    }
    if (cVar2 != '/') goto LAB_003cc48e;
    local_b0.first._M_len = 0xa4;
    local_b0.first._M_str =
         "called with network path DESTINATION. This does not make sense when using DESTDIR. Specify local absolute path or remove DESTDIR environment variable.\nDESTINATION=\n"
    ;
    local_b0.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_88 = 0;
    views._M_len = 2;
    views._M_array = &local_b0;
    uStack_98 = uVar5;
    local_90 = pcVar4;
    cmCatViews(&local_80,views);
    std::__cxx11::string::_M_assign((string *)&((this->super_cmFileCopier).Status)->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) goto LAB_003cc6fd;
LAB_003cc6f5:
    operator_delete(local_80._M_dataplus._M_p,
                    (ulong)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_80.field_2._M_allocated_capacity)->_M_dataplus)._M_p +
                           1));
  }
  else {
LAB_003cc54a:
    local_40 = &local_34;
    local_34 = 0;
    bVar6 = cmFileCopier::GetDefaultDirectoryPermissions(&this->super_cmFileCopier,&local_40);
    if (bVar6) {
      bVar6 = true;
      if (*(int *)&(this->super_cmFileCopier).field_0xf4 == 6) goto LAB_003cc6ff;
      bVar7 = cmsys::SystemTools::FileExists(filename);
      if ((bVar7) ||
         (SVar10 = cmsys::SystemTools::MakeDirectory(filename,local_40), SVar10.Kind_ == Success)) {
        bVar7 = cmsys::SystemTools::FileIsDirectory(filename);
        if (bVar7) goto LAB_003cc6ff;
        std::operator+(&local_80,"INSTALL destination: ",filename);
        puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_80);
        local_b0.first._M_len = (size_t)&local_b0.second;
        plVar9 = puVar11 + 2;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)*puVar11 ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)plVar9) {
          local_b0.second =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar9;
          uStack_98 = puVar11[3];
        }
        else {
          local_b0.second =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar9;
          local_b0.first._M_len = (size_t)*puVar11;
        }
        local_b0.first._M_str = (char *)puVar11[1];
        *puVar11 = plVar9;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,
                          (ulong)(local_80.field_2._M_allocated_capacity + 1));
        }
        std::__cxx11::string::_M_assign((string *)&((this->super_cmFileCopier).Status)->Error);
      }
      else {
        std::operator+(&local_80,"cannot create directory: ",filename);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_80);
        local_b0.first._M_len = (size_t)&local_b0.second;
        plVar12 = plVar9 + 2;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)*plVar9 ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)plVar12) {
          local_b0.second =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar12;
          uStack_98 = plVar9[3];
        }
        else {
          local_b0.second =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar12;
          local_b0.first._M_len = (size_t)*plVar9;
        }
        local_b0.first._M_str = (char *)plVar9[1];
        *plVar9 = (long)plVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,
                          (ulong)(local_80.field_2._M_allocated_capacity + 1));
        }
        std::__cxx11::string::_M_assign((string *)&((this->super_cmFileCopier).Status)->Error);
      }
LAB_003cc6e6:
      local_80.field_2._M_allocated_capacity = (size_type)local_b0.second;
      local_80._M_dataplus._M_p = (pointer)local_b0.first._M_len;
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
          local_b0.first._M_len != &local_b0.second) goto LAB_003cc6f5;
    }
  }
LAB_003cc6fd:
  bVar6 = false;
LAB_003cc6ff:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return bVar6;
}

Assistant:

bool cmFileInstaller::HandleInstallDestination()
{
  std::string& destination = this->Destination;

  // allow for / to be a valid destination
  if (destination.size() < 2 && destination != "/") {
    this->Status.SetError("called with inappropriate arguments. "
                          "No DESTINATION provided or .");
    return false;
  }

  std::string sdestdir;
  if (cmSystemTools::GetEnv("DESTDIR", sdestdir) && !sdestdir.empty()) {
    cmSystemTools::ConvertToUnixSlashes(sdestdir);
    char ch1 = destination[0];
    char ch2 = destination[1];
    char ch3 = 0;
    if (destination.size() > 2) {
      ch3 = destination[2];
    }
    int skip = 0;
    if (ch1 != '/') {
      int relative = 0;
      if (((ch1 >= 'a' && ch1 <= 'z') || (ch1 >= 'A' && ch1 <= 'Z')) &&
          ch2 == ':') {
        // Assume windows
        // let's do some destdir magic:
        skip = 2;
        if (ch3 != '/') {
          relative = 1;
        }
      } else {
        relative = 1;
      }
      if (relative) {
        // This is relative path on unix or windows. Since we are doing
        // destdir, this case does not make sense.
        this->Status.SetError(
          "called with relative DESTINATION. This "
          "does not make sense when using DESTDIR. Specify "
          "absolute path or remove DESTDIR environment variable.");
        return false;
      }
    } else {
      if (ch2 == '/') {
        // looks like a network path.
        std::string message =
          cmStrCat("called with network path DESTINATION. This "
                   "does not make sense when using DESTDIR. Specify local "
                   "absolute path or remove DESTDIR environment variable."
                   "\nDESTINATION=\n",
                   destination);
        this->Status.SetError(message);
        return false;
      }
    }
    destination = sdestdir + destination.substr(skip);
    this->DestDirLength = static_cast<int>(sdestdir.size());
  }

  // check if default dir creation permissions were set
  mode_t default_dir_mode_v = 0;
  mode_t* default_dir_mode = &default_dir_mode_v;
  if (!this->GetDefaultDirectoryPermissions(&default_dir_mode)) {
    return false;
  }

  if (this->InstallType != cmInstallType_DIRECTORY) {
    if (!cmSystemTools::FileExists(destination)) {
      if (!cmSystemTools::MakeDirectory(destination, default_dir_mode)) {
        std::string errstring = "cannot create directory: " + destination +
          ". Maybe need administrative privileges.";
        this->Status.SetError(errstring);
        return false;
      }
    }
    if (!cmSystemTools::FileIsDirectory(destination)) {
      std::string errstring =
        "INSTALL destination: " + destination + " is not a directory.";
      this->Status.SetError(errstring);
      return false;
    }
  }
  return true;
}